

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Stress::anon_unknown_0::TextureSamplerCase::iterate(TextureSamplerCase *this)

{
  ostringstream *this_00;
  RenderContext *context;
  short sVar1;
  bool bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  deUint32 err;
  void *__s;
  void *__s_00;
  void *__s_01;
  short *psVar6;
  undefined4 extraout_var;
  short sVar7;
  long lVar8;
  int x;
  char *description;
  long lVar9;
  qpTestResult testResult;
  short *psVar10;
  undefined8 uVar11;
  short sVar12;
  short sVar13;
  int iVar14;
  long lVar15;
  void *pvVar16;
  value_type_conflict3 *__val;
  float posX;
  float fVar17;
  Surface resultImage;
  Surface local_1d0;
  TextureFormat local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  __s = operator_new(0x1e40);
  memset(__s,0,0x1e40);
  __s_00 = operator_new(0xf20);
  memset(__s_00,0,0xf20);
  __s_01 = operator_new(0x14ac);
  memset(__s_01,0,0x14ac);
  tcu::Surface::Surface(&local_1d0,0x100,0x100);
  lVar9 = (long)__s + 0xc;
  lVar8 = 0;
  pvVar16 = __s_00;
  do {
    fVar17 = (float)(int)lVar8 / 21.0;
    uVar3 = (&Stress::(anonymous_namespace)::s_specialFloats)[lVar8];
    iVar14 = 0;
    lVar15 = 0;
    do {
      *(float *)(lVar9 + -0xc + lVar15 * 4) = fVar17 + fVar17 + -1.0;
      *(float *)(lVar9 + -8 + lVar15 * 4) = (float)iVar14 / 21.0 + (float)iVar14 / 21.0 + -1.0;
      *(undefined8 *)(lVar9 + -4 + lVar15 * 4) = 0x3f80000000000000;
      *(ulong *)((long)pvVar16 + lVar15 * 2) =
           CONCAT44(*(undefined4 *)((long)&Stress::(anonymous_namespace)::s_specialFloats + lVar15),
                    uVar3);
      lVar15 = lVar15 + 4;
      iVar14 = iVar14 + 1;
    } while (lVar15 != 0x58);
    lVar8 = lVar8 + 1;
    lVar9 = lVar9 + 0x160;
    pvVar16 = (void *)((long)pvVar16 + 0xb0);
  } while (lVar8 != 0x16);
  psVar6 = (short *)((long)__s_01 + 10);
  sVar7 = 0;
  lVar8 = 0;
  do {
    lVar9 = -0x15;
    psVar10 = psVar6;
    do {
      sVar1 = (short)lVar9;
      sVar12 = sVar7 + sVar1 + 0x15;
      psVar10[-5] = sVar12;
      sVar13 = sVar7 + 0x2c + sVar1;
      psVar10[-4] = sVar13;
      psVar10[-3] = sVar7 + 0x2b + sVar1;
      psVar10[-2] = sVar12;
      psVar10[-1] = sVar13;
      *psVar10 = sVar7 + sVar1 + 0x16;
      psVar10 = psVar10 + 6;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0);
    lVar8 = lVar8 + 1;
    sVar7 = sVar7 + 0x16;
    psVar6 = psVar6 + 0x7e;
  } while (lVar8 != 0x15);
  local_1b0._0_8_ =
       ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Drawing a textured grid with the shader. Sampling from the texture using special floating point values."
             ,0x67);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  iVar14 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
             [3])();
  lVar8 = CONCAT44(extraout_var,iVar14);
  uVar3 = (**(code **)(lVar8 + 0x780))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"a_pos");
  uVar4 = (**(code **)(lVar8 + 0x780))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"a_attr");
  uVar5 = (**(code **)(lVar8 + 0xb48))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"u_sampler");
  (**(code **)(lVar8 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar8 + 0x188))(0x4000);
  (**(code **)(lVar8 + 0x1a00))(0,0,0x100,0x100);
  (**(code **)(lVar8 + 0x1680))((((this->super_RenderCase).m_program)->m_program).m_program);
  (**(code **)(lVar8 + 0x14f0))(uVar5,0);
  uVar11 = 0xde1;
  if (this->m_testType == TEST_TEX_COORD_CUBE) {
    uVar11 = 0x8513;
  }
  (**(code **)(lVar8 + 0xb8))(uVar11,this->m_textureID);
  (**(code **)(lVar8 + 0x19f0))(uVar3,4,0x1406,0,0,__s);
  (**(code **)(lVar8 + 0x19f0))(uVar4,2,0x1406,0,0,__s_00);
  (**(code **)(lVar8 + 0x610))(uVar3);
  (**(code **)(lVar8 + 0x610))(uVar4);
  (**(code **)(lVar8 + 0x568))(4,0xa56,0x1403,__s_01);
  (**(code **)(lVar8 + 0x518))(uVar3);
  (**(code **)(lVar8 + 0x518))(uVar4);
  (**(code **)(lVar8 + 0x1680))(0);
  (**(code **)(lVar8 + 0x648))();
  err = (**(code **)(lVar8 + 0x800))();
  glu::checkError(err,"TextureSamplerCase::iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                  ,0x60a);
  context = ((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx;
  local_1b8.order = RGBA;
  local_1b8.type = UNORM_INT8;
  if ((void *)local_1d0.m_pixels.m_cap != (void *)0x0) {
    local_1d0.m_pixels.m_cap = (size_t)local_1d0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,&local_1b8,local_1d0.m_width,local_1d0.m_height,1,
             (void *)local_1d0.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
  bVar2 = RenderCase::checkResultImage(&this->super_RenderCase,&local_1d0);
  if (bVar2) {
    bVar2 = RenderCase::drawTestPattern(&this->super_RenderCase,true);
    testResult = (qpTestResult)!bVar2;
    description = "test pattern failed";
    if (bVar2) {
      description = "Pass";
    }
  }
  else {
    description = "missing or invalid fragments";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult
            ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             testResult,description);
  tcu::Surface::~Surface(&local_1d0);
  operator_delete(__s_01,0x14ac);
  operator_delete(__s_00,0xf20);
  operator_delete(__s,0x1e40);
  return STOP;
}

Assistant:

TextureSamplerCase::IterateResult TextureSamplerCase::iterate (void)
{
	// Draw a grid and texture it with a texture and sample it using special special values. The result samples should all have the green channel at 255 as per the test image.

	std::vector<tcu::Vec4>	gridVertices	(DE_LENGTH_OF_ARRAY(s_specialFloats) * DE_LENGTH_OF_ARRAY(s_specialFloats));
	std::vector<tcu::UVec2>	gridTexCoords	(DE_LENGTH_OF_ARRAY(s_specialFloats) * DE_LENGTH_OF_ARRAY(s_specialFloats));
	std::vector<deUint16>	indices			((DE_LENGTH_OF_ARRAY(s_specialFloats) - 1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) - 1) * 6);
	tcu::Surface			resultImage		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// vertices
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats); ++x)
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats); ++y)
	{
		const float posX = (float)x / ((float)DE_LENGTH_OF_ARRAY(s_specialFloats) - 1.0f) * 2.0f - 1.0f; // map from [0, len(s_specialFloats) - 1] to [-1, 1]
		const float posY = (float)y / ((float)DE_LENGTH_OF_ARRAY(s_specialFloats) - 1.0f) * 2.0f - 1.0f;

		gridVertices[x * DE_LENGTH_OF_ARRAY(s_specialFloats) + y]	= tcu::Vec4(posX, posY, 0.0f, 1.0f);
		gridTexCoords[x * DE_LENGTH_OF_ARRAY(s_specialFloats) + y]	= tcu::UVec2(s_specialFloats[x], s_specialFloats[y]);
	}

	// tiles
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats) - 1; ++x)
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats) - 1; ++y)
	{
		const int baseNdx = (x * (DE_LENGTH_OF_ARRAY(s_specialFloats) - 1) + y) * 6;

		indices[baseNdx + 0] = (deUint16)((x+0) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+0));
		indices[baseNdx + 1] = (deUint16)((x+1) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+1));
		indices[baseNdx + 2] = (deUint16)((x+1) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+0));

		indices[baseNdx + 3] = (deUint16)((x+0) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+0));
		indices[baseNdx + 4] = (deUint16)((x+1) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+1));
		indices[baseNdx + 5] = (deUint16)((x+0) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+1));
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Drawing a textured grid with the shader. Sampling from the texture using special floating point values." << tcu::TestLog::EndMessage;

	// Draw grid
	{
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const GLint				positionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_pos");
		const GLint				texCoordLoc	= gl.getAttribLocation(m_program->getProgram(), "a_attr");
		const GLint				samplerLoc	= gl.getUniformLocation(m_program->getProgram(), "u_sampler");

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(m_program->getProgram());

		gl.uniform1i(samplerLoc, 0);
		if (m_testType != TEST_TEX_COORD_CUBE)
			gl.bindTexture(GL_TEXTURE_2D, m_textureID);
		else
			gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_textureID);

		gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridVertices[0]);
		gl.vertexAttribPointer(texCoordLoc, 2, GL_FLOAT, GL_FALSE, 0, &gridTexCoords[0]);

		gl.enableVertexAttribArray(positionLoc);
		gl.enableVertexAttribArray(texCoordLoc);
		gl.drawElements(GL_TRIANGLES, (glw::GLsizei)(indices.size()), GL_UNSIGNED_SHORT, &indices[0]);
		gl.disableVertexAttribArray(positionLoc);
		gl.disableVertexAttribArray(texCoordLoc);

		gl.useProgram(0);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "TextureSamplerCase::iterate");

		glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
	}

	// verify everywhere was drawn and samples were from the texture (all pixels have Green = 255)
	if (!checkResultImage(resultImage))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "missing or invalid fragments");
		return STOP;
	}

	// test drawing and textures still works
	if (!drawTestPattern(true))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "test pattern failed");
		return STOP;
	}

	// all ok
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}